

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall
Assimp::FBX::Node::AddP70<long>
          (Node *this,string *name,string *type,string *type2,string *flags,long more)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  Node n;
  long more_local;
  string *flags_local;
  string *type2_local;
  string *type_local;
  string *name_local;
  Node *this_local;
  
  n.property_start = more;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"P",&local_c9);
  Node((Node *)local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::string((string *)&local_100,(string *)name);
  std::__cxx11::string::string((string *)&local_120,(string *)type);
  std::__cxx11::string::string((string *)&local_140,(string *)type2);
  std::__cxx11::string::string((string *)&local_160,(string *)flags);
  AddProperties<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,long>
            ((Node *)local_a8,&local_100,&local_120,&local_140,&local_160,n.property_start);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  AddChild(this,(Node *)local_a8);
  ~Node((Node *)local_a8);
  return;
}

Assistant:

void AddP70(
        const std::string& name,
        const std::string& type,
        const std::string& type2,
        const std::string& flags,
        More... more
    ) {
        Node n("P");
        n.AddProperties(name, type, type2, flags, more...);
        AddChild(n);
    }